

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::BitCastScalarOrVector::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  pointer this_00;
  Op OVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference ppCVar4;
  TypeManager *this_01;
  Type *type_00;
  ConstantManager *const_mgr_00;
  Constant *c;
  Instruction *this_02;
  bool bVar5;
  Operand *local_120;
  allocator<spvtools::opt::Operand> local_105;
  uint32_t local_104;
  iterator local_100;
  undefined8 local_f8;
  SmallVector<unsigned_int,_2UL> local_f0;
  Operand local_c8;
  iterator local_98;
  _func_int **local_90;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_88;
  uint32_t local_6c;
  Constant *pCStack_68;
  uint32_t new_feeder_id;
  Constant *bitcasted_constant;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  ConstantManager *const_mgr;
  Type *type;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  bVar5 = false;
  if (OVar1 == OpBitcast) {
    sVar3 = std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::size(constants);
    bVar5 = sVar3 == 1;
  }
  if (bVar5) {
    ppCVar4 = std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::operator[](constants,0);
    if (*ppCVar4 == (value_type)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_01 = IRContext::get_type_mgr(context);
      uVar2 = opt::Instruction::type_id(inst);
      type_00 = analysis::TypeManager::GetType(this_01,uVar2);
      bVar5 = HasFloatingPoint(type_00);
      if ((!bVar5) || (bVar5 = opt::Instruction::IsFloatingPointFoldingAllowed(inst), bVar5)) {
        const_mgr_00 = IRContext::get_constant_mgr(context);
        words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)const_mgr_00;
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](constants,0);
        GetWordsFromNumericScalarOrVectorConstant
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,const_mgr_00,
                   *ppCVar4);
        sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
        if (sVar3 == 0) {
          this_local._7_1_ = false;
        }
        else {
          c = ConvertWordsToNumericScalarOrVectorConstant
                        ((ConstantManager *)
                         words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,type_00);
          this_00 = words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          pCStack_68 = c;
          if (c == (Constant *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            uVar2 = opt::Instruction::type_id(inst);
            this_02 = analysis::ConstantManager::GetDefiningInstruction
                                ((ConstantManager *)this_00,c,uVar2,(inst_iterator *)0x0);
            local_6c = opt::Instruction::result_id(this_02);
            opt::Instruction::SetOpcode(inst,OpCopyObject);
            local_104 = local_6c;
            local_100 = &local_104;
            local_f8 = 1;
            init_list._M_len = 1;
            init_list._M_array = local_100;
            utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f0,init_list);
            Operand::Operand(&local_c8,SPV_OPERAND_TYPE_ID,&local_f0);
            local_98 = &local_c8;
            local_90 = (_func_int **)0x1;
            std::allocator<spvtools::opt::Operand>::allocator(&local_105);
            __l._M_len = (size_type)local_90;
            __l._M_array = local_98;
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                      (&local_88,__l,&local_105);
            opt::Instruction::SetInOperands(inst,&local_88);
            std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                      (&local_88);
            std::allocator<spvtools::opt::Operand>::~allocator(&local_105);
            local_120 = (Operand *)&local_98;
            do {
              local_120 = local_120 + -1;
              Operand::~Operand(local_120);
            } while (local_120 != &local_c8);
            utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f0);
            this_local._7_1_ = true;
          }
        }
        bitcasted_constant._4_4_ = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpBitcast && constants.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x89f,
                "auto spvtools::opt::(anonymous namespace)::BitCastScalarOrVector()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule BitCastScalarOrVector() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpBitcast && constants.size() == 1);
    if (constants[0] == nullptr) return false;

    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());
    if (HasFloatingPoint(type) && !inst->IsFloatingPointFoldingAllowed())
      return false;

    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    std::vector<uint32_t> words =
        GetWordsFromNumericScalarOrVectorConstant(const_mgr, constants[0]);
    if (words.size() == 0) return false;

    const analysis::Constant* bitcasted_constant =
        ConvertWordsToNumericScalarOrVectorConstant(const_mgr, words, type);
    if (!bitcasted_constant) return false;

    auto new_feeder_id =
        const_mgr->GetDefiningInstruction(bitcasted_constant, inst->type_id())
            ->result_id();
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {new_feeder_id}}});
    return true;
  };
}